

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLCryptoFactory.cpp
# Opt level: O0

AsymmetricAlgorithm * __thiscall
OSSLCryptoFactory::getAsymmetricAlgorithm(OSSLCryptoFactory *this,Type algorithm)

{
  uint in_ESI;
  OSSLRSA *in_stack_ffffffffffffffa0;
  AsymmetricAlgorithm *local_8;
  
  switch(in_ESI) {
  case 1:
    local_8 = (AsymmetricAlgorithm *)operator_new(0x40);
    OSSLRSA::OSSLRSA(in_stack_ffffffffffffffa0);
    break;
  case 2:
    local_8 = (AsymmetricAlgorithm *)operator_new(0x30);
    OSSLDSA::OSSLDSA((OSSLDSA *)in_stack_ffffffffffffffa0);
    break;
  case 3:
    local_8 = (AsymmetricAlgorithm *)operator_new(0x28);
    local_8->currentPrivateKey = (PrivateKey *)0x0;
    local_8->currentMechanism = Unknown;
    local_8->currentPadding = Unknown;
    ((AsymmetricAlgorithm *)&local_8->_vptr_AsymmetricAlgorithm)->_vptr_AsymmetricAlgorithm =
         (_func_int **)0x0;
    local_8->currentPublicKey = (PublicKey *)0x0;
    *(undefined8 *)&local_8->currentOperation = 0;
    OSSLDH::OSSLDH((OSSLDH *)in_stack_ffffffffffffffa0);
    break;
  case 4:
    local_8 = (AsymmetricAlgorithm *)operator_new(0x28);
    local_8->currentPrivateKey = (PrivateKey *)0x0;
    local_8->currentMechanism = Unknown;
    local_8->currentPadding = Unknown;
    ((AsymmetricAlgorithm *)&local_8->_vptr_AsymmetricAlgorithm)->_vptr_AsymmetricAlgorithm =
         (_func_int **)0x0;
    local_8->currentPublicKey = (PublicKey *)0x0;
    *(undefined8 *)&local_8->currentOperation = 0;
    OSSLECDH::OSSLECDH((OSSLECDH *)in_stack_ffffffffffffffa0);
    break;
  case 5:
    local_8 = (AsymmetricAlgorithm *)operator_new(0x28);
    local_8->currentPrivateKey = (PrivateKey *)0x0;
    local_8->currentMechanism = Unknown;
    local_8->currentPadding = Unknown;
    ((AsymmetricAlgorithm *)&local_8->_vptr_AsymmetricAlgorithm)->_vptr_AsymmetricAlgorithm =
         (_func_int **)0x0;
    local_8->currentPublicKey = (PublicKey *)0x0;
    *(undefined8 *)&local_8->currentOperation = 0;
    OSSLECDSA::OSSLECDSA((OSSLECDSA *)in_stack_ffffffffffffffa0);
    break;
  default:
    softHSMLog(3,"getAsymmetricAlgorithm",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLCryptoFactory.cpp"
               ,0x164,"Unknown algorithm \'%i\'",(ulong)in_ESI);
    local_8 = (AsymmetricAlgorithm *)0x0;
    break;
  case 7:
    local_8 = (AsymmetricAlgorithm *)operator_new(0x28);
    local_8->currentPrivateKey = (PrivateKey *)0x0;
    local_8->currentMechanism = Unknown;
    local_8->currentPadding = Unknown;
    ((AsymmetricAlgorithm *)&local_8->_vptr_AsymmetricAlgorithm)->_vptr_AsymmetricAlgorithm =
         (_func_int **)0x0;
    local_8->currentPublicKey = (PublicKey *)0x0;
    *(undefined8 *)&local_8->currentOperation = 0;
    OSSLEDDSA::OSSLEDDSA((OSSLEDDSA *)local_8);
  }
  return local_8;
}

Assistant:

AsymmetricAlgorithm* OSSLCryptoFactory::getAsymmetricAlgorithm(AsymAlgo::Type algorithm)
{
	switch (algorithm)
	{
		case AsymAlgo::RSA:
			return new OSSLRSA();
		case AsymAlgo::DSA:
			return new OSSLDSA();
		case AsymAlgo::DH:
			return new OSSLDH();
#ifdef WITH_ECC
		case AsymAlgo::ECDH:
			return new OSSLECDH();
		case AsymAlgo::ECDSA:
			return new OSSLECDSA();
#endif
#ifdef WITH_GOST
		case AsymAlgo::GOST:
			return new OSSLGOST();
#endif
#ifdef WITH_EDDSA
		case AsymAlgo::EDDSA:
			return new OSSLEDDSA();
#endif
		default:
			break;
	}

	// No algorithm implementation is available
	ERROR_MSG("Unknown algorithm '%i'", algorithm);
	return NULL;
}